

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O3

bool loadSphereDataBuffers(float dt)

{
  int iVar1;
  GLenum GVar2;
  mat4 view;
  mat4 viewInv;
  undefined1 local_1e8 [64];
  mat4 mStack_1a8;
  float_t fStack_168;
  float_t fStack_164;
  float_t fStack_160;
  float_t fStack_15c;
  float_t fStack_158;
  float_t local_154;
  undefined8 local_150;
  vec4 vStack_148;
  float_t fStack_138;
  float_t fStack_134;
  float_t fStack_130;
  float_t local_12c;
  float_t fStack_128;
  float_t fStack_124;
  float_t fStack_120;
  float_t fStack_11c;
  float_t fStack_118;
  float_t fStack_114;
  undefined8 uStack_110;
  vec4 vStack_108;
  float_t fStack_f8;
  float_t fStack_f4;
  float_t fStack_f0;
  float_t local_ec;
  mat4 local_e8;
  mat4 local_a8;
  mat4 local_68;
  
  local_1e8._0_4_ = 1.0;
  local_1e8._4_4_ = 0.0;
  local_1e8._8_4_ = 0.0;
  local_1e8._12_4_ = 0.0;
  local_1e8._16_4_ = 0.0;
  local_1e8._20_4_ = 1.0;
  local_1e8._24_4_ = 0.0;
  local_1e8._28_4_ = 0.0;
  local_1e8._32_4_ = 0.0;
  local_1e8._36_4_ = 0.0;
  local_1e8._40_4_ = 1.0;
  local_1e8._44_4_ = 0.0;
  local_1e8._48_4_ = 0.0;
  local_1e8._52_4_ = 0.0;
  local_1e8._56_4_ = 0.0;
  stack0xfffffffffffffe54 = 0x3f8000003f800000;
  mStack_1a8.m[0].y = 0.0;
  mStack_1a8.m[0].z = 0.0;
  mStack_1a8.m[0].w = 0.0;
  mStack_1a8.m[1].x = 0.0;
  mStack_1a8.m[1].y = 1.0;
  mStack_1a8.m[1].z = 0.0;
  mStack_1a8.m[1].w = 0.0;
  mStack_1a8.m[2].x = 0.0;
  mStack_1a8.m[2].y = 0.0;
  mStack_1a8.m[2].z = 1.0;
  mStack_1a8.m[2].w = 0.0;
  mStack_1a8.m[3].x = 0.0;
  mStack_1a8.m[3].y = 0.0;
  mStack_1a8.m[3].z = 0.0;
  mStack_1a8.m[3].w = 1.0;
  fStack_168 = 1.0;
  fStack_164 = 0.0;
  fStack_160 = 0.0;
  fStack_15c = 0.0;
  fStack_158 = 0.0;
  local_154 = 1.0;
  local_150 = 0;
  vStack_148.x = 0.0;
  vStack_148.y = 0.0;
  vStack_148.z = 1.0;
  vStack_148.w = 0.0;
  fStack_138 = 0.0;
  fStack_134 = 0.0;
  fStack_130 = 0.0;
  local_12c = 1.0;
  fStack_128 = 1.0;
  fStack_124 = 0.0;
  fStack_120 = 0.0;
  fStack_11c = 0.0;
  fStack_118 = 0.0;
  fStack_114 = 1.0;
  uStack_110 = 0;
  vStack_108.x = 0.0;
  vStack_108.y = 0.0;
  vStack_108.z = 1.0;
  vStack_108.w = 0.0;
  fStack_f8 = 0.0;
  fStack_f4 = 0.0;
  fStack_f0 = 0.0;
  local_ec = 1.0;
  if (loadSphereDataBuffers(float)::first == '\0') {
    g_gl.streams[1] = djgb_create(0x100);
    loadSphereDataBuffers(float)::first = '\x01';
  }
  dja::mat4::homogeneous::perspective
            (&mStack_1a8,(g_camera.fovy * 3.1415927) / 180.0,
             (float)g_framebuffer.w / (float)g_framebuffer.h,g_camera.zNear,g_camera.zFar);
  local_a8.m[0].x = 1.0;
  local_a8.m[0].y = 0.0;
  local_a8.m[0].z = 0.0;
  local_a8.m[0].w = g_camera.pos.x;
  local_a8.m[1].x = 0.0;
  local_a8.m[1].y = 1.0;
  local_a8.m[1].z = 0.0;
  local_a8.m[1].w = g_camera.pos.y;
  local_a8.m[2].x = 0.0;
  local_a8.m[2].y = 0.0;
  local_a8.m[2].z = 1.0;
  local_a8.m[2].w = g_camera.pos.z;
  local_a8.m[3].x = 0.0;
  local_a8.m[3].y = 0.0;
  local_a8.m[3].z = 0.0;
  local_a8.m[3].w = 1.0;
  local_e8.m[0].x = g_camera.axis.m[0].x;
  local_e8.m[0].y = g_camera.axis.m[0].y;
  local_e8.m[0].z = g_camera.axis.m[0].z;
  local_e8.m[0].w = 0.0;
  local_e8.m[1].x = g_camera.axis.m[1].x;
  local_e8.m[1].y = g_camera.axis.m[1].y;
  local_e8.m[1].w = 0.0;
  local_e8.m[1].z = g_camera.axis.m[1].z;
  local_e8.m[2].x = g_camera.axis.m[2].x;
  local_e8.m[2].y = g_camera.axis.m[2].y;
  local_e8.m[2].z = g_camera.axis.m[2].z;
  local_e8.m[2].w = 0.0;
  local_e8.m[3].x = 0.0;
  local_e8.m[3].y = 0.0;
  local_e8.m[3].z = 0.0;
  local_e8.m[3].w = 1.0;
  dja::operator*(&local_a8,&local_e8);
  dja::inverse(&local_a8,&local_68);
  local_e8.m[0].x = 1.0;
  local_e8.m[0].y = 0.0;
  local_e8.m[0].z = 0.0;
  local_e8.m[0].w = 0.0;
  local_e8.m[1].x = 0.0;
  local_e8.m[1].y = 1.0;
  local_e8.m[1].z = 0.0;
  local_e8.m[1].w = 0.0;
  local_e8.m[2].x = 0.0;
  local_e8.m[2].y = 0.0;
  local_e8.m[2].z = 1.0;
  local_e8.m[2].w = 0.0;
  local_e8.m[3].x = 0.0;
  local_e8.m[3].y = 0.0;
  local_e8.m[3].z = 0.0;
  local_e8.m[3].w = 1.0;
  dja::operator*(&local_a8,&local_e8);
  dja::operator*(&mStack_1a8,(mat4 *)local_1e8);
  fStack_138 = local_e8.m[3].x;
  fStack_134 = local_e8.m[3].y;
  fStack_130 = local_e8.m[3].z;
  local_12c = local_e8.m[3].w;
  vStack_148.x = local_e8.m[2].x;
  vStack_148.y = local_e8.m[2].y;
  vStack_148.z = local_e8.m[2].z;
  vStack_148.w = local_e8.m[2].w;
  fStack_158 = local_e8.m[1].x;
  local_154 = local_e8.m[1].y;
  local_150._0_4_ = local_e8.m[1].z;
  local_150._4_4_ = local_e8.m[1].w;
  fStack_168 = local_e8.m[0].x;
  fStack_164 = local_e8.m[0].y;
  fStack_160 = local_e8.m[0].z;
  fStack_15c = local_e8.m[0].w;
  fStack_128 = local_68.m[0].x;
  fStack_124 = local_68.m[0].y;
  fStack_120 = local_68.m[0].z;
  fStack_11c = local_68.m[0].w;
  fStack_118 = local_68.m[1].x;
  fStack_114 = local_68.m[1].y;
  uStack_110._0_4_ = local_68.m[1].z;
  uStack_110._4_4_ = local_68.m[1].w;
  vStack_108.x = local_68.m[2].x;
  vStack_108.y = local_68.m[2].y;
  vStack_108.z = local_68.m[2].z;
  vStack_108.w = local_68.m[2].w;
  fStack_f8 = local_68.m[3].x;
  fStack_f4 = local_68.m[3].y;
  fStack_f0 = local_68.m[3].z;
  local_ec = local_68.m[3].w;
  djgb_to_gl(g_gl.streams[1],local_1e8,(int *)0x0);
  iVar1 = g_gl.streams[1]->capacity;
  (*glad_glBindBufferRange)
            (0x8a11,1,g_gl.streams[1]->gl,
             (long)(((g_gl.streams[1]->offset - g_gl.streams[1]->size) % iVar1 + iVar1) % iVar1),
             (long)g_gl.streams[1]->size);
  GVar2 = (*glad_glGetError)();
  return GVar2 == 0;
}

Assistant:

bool loadSphereDataBuffers(float dt = 0)
{
    static bool first = true;
    struct Transform {
        dja::mat4 modelView, projection, modelViewProjection, viewInv;
    } transform;

    if (first) {
        g_gl.streams[STREAM_TRANSFORM] = djgb_create(sizeof(transform));
        first = false;
    }

    // extract view and projection matrices
    dja::mat4 projection = dja::mat4::homogeneous::perspective(
        radians(g_camera.fovy),
        (float)g_framebuffer.w / (float)g_framebuffer.h,
        g_camera.zNear,
        g_camera.zFar
    );
    dja::mat4 viewInv = dja::mat4::homogeneous::translation(g_camera.pos)
                      * dja::mat4::homogeneous::from_mat3(g_camera.axis);
    dja::mat4 view = dja::inverse(viewInv);


    // upload transformations
    transform.projection = projection;
    transform.modelView  = view * dja::mat4(1);
    transform.modelViewProjection = transform.projection * transform.modelView;
    transform.viewInv = viewInv;

    // upload planet data
    djgb_to_gl(g_gl.streams[STREAM_TRANSFORM], (const void *)&transform, NULL);
    djgb_glbindrange(g_gl.streams[STREAM_TRANSFORM],
                     GL_UNIFORM_BUFFER,
                     STREAM_TRANSFORM);

    return (glGetError() == GL_NO_ERROR);
}